

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall
wasm::OptimizeInstructions::visitArrayNewFixed(OptimizeInstructions *this,ArrayNewFixed *curr)

{
  Type *this_00;
  size_t sVar1;
  ulong uVar2;
  Expression **ppEVar3;
  bool bVar4;
  ulong uVar5;
  Expression *pEVar6;
  HeapType HVar7;
  Const *pCVar8;
  ArrayNew *pAVar9;
  Block *this_01;
  uint uVar10;
  optional<wasm::Type> type_;
  undefined1 local_a8 [8];
  ChildLocalizer localizer;
  anon_union_16_6_1532cd5a_for_Literal_0 local_60;
  Type local_48;
  Type type;
  Builder builder;
  
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type.id != 1) &&
     (sVar1 = (curr->values).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements, sVar1 != 0)) {
    this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type;
    uVar10 = 1;
    do {
      uVar5 = (ulong)(uVar10 - 1);
      if (sVar1 - 1 <= uVar5) {
        type.id = (uintptr_t)
                  (this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).
                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .
                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .currModule;
        local_60.i64 = (int64_t)wasm::Type::getHeapType(this_00);
        HeapType::getArray((HeapType *)local_a8);
        local_48.id = (uintptr_t)local_a8;
        bVar4 = wasm::Type::isDefaultable(&local_48);
        if (bVar4) {
          if ((curr->values).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements == 0) goto LAB_009e23b1;
          pEVar6 = getFallthrough(this,*(curr->values).
                                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                        .data);
          bVar4 = Properties::isSingleConstantExpression(pEVar6);
          if (bVar4) {
            Properties::getLiteral((Literal *)&local_60.func,pEVar6);
            Literal::makeZero((Literal *)&localizer.hasUnreachableChild,local_48);
            bVar4 = Literal::operator==((Literal *)&local_60.func,
                                        (Literal *)&localizer.hasUnreachableChild);
            Literal::~Literal((Literal *)&localizer.hasUnreachableChild);
            Literal::~Literal((Literal *)&local_60.func);
          }
          else {
            bVar4 = false;
          }
          if (bVar4 != false) {
            HVar7 = wasm::Type::getHeapType(this_00);
            pCVar8 = Builder::makeConst<int>((Builder *)&type,(int)sVar1);
            pAVar9 = Builder::makeArrayNew
                               ((Builder *)&type,HVar7,(Expression *)pCVar8,(Expression *)0x0);
            pEVar6 = wasm::getDroppedChildrenAndAppend
                               ((Expression *)curr,
                                (this->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).
                                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .
                                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .currModule,
                                &((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                  ).super_Pass.runner)->options,(Expression *)pAVar9,
                                NoticeParentEffects);
            replaceCurrent(this,pEVar6);
            return;
          }
        }
        if (sVar1 == 1) {
          return;
        }
        ChildLocalizer::ChildLocalizer
                  ((ChildLocalizer *)local_a8,(Expression *)curr,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).
                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .
                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .currFunction,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).
                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .
                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .currModule,
                   &((this->
                     super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                     ).super_Pass.runner)->options);
        this_01 = ChildLocalizer::getChildrenReplacement((ChildLocalizer *)local_a8);
        HVar7 = wasm::Type::getHeapType(this_00);
        pCVar8 = Builder::makeConst<int>((Builder *)&type,(int)sVar1);
        if ((curr->values).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            != 0) {
          pAVar9 = Builder::makeArrayNew
                             ((Builder *)&type,HVar7,(Expression *)pCVar8,
                              *(curr->values).
                               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               .data);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(this_01->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     (Expression *)pAVar9);
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pAVar9;
          Block::finalize(this_01,type_,Unknown);
          replaceCurrent(this,(Expression *)this_01);
          if (localizer.wasm == (Module *)0x0) {
            return;
          }
          operator_delete(localizer.wasm,
                          (long)localizer.sets.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)localizer.wasm);
          return;
        }
LAB_009e23b1:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      uVar2 = (curr->values).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      if ((uVar2 <= uVar5) || (uVar2 <= uVar10)) goto LAB_009e23b1;
      ppEVar3 = (curr->values).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      bVar4 = areConsecutiveInputsEqual(this,ppEVar3[uVar5],ppEVar3[uVar10]);
      uVar10 = uVar10 + 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void visitArrayNewFixed(ArrayNewFixed* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    auto size = curr->values.size();
    if (size == 0) {
      // TODO: Consider what to do in the trivial case of an empty array: we can
      //       can use ArrayNew or ArrayNewFixed there. Measure which is best.
      return;
    }

    // If all the values are equal then we can optimize, either to
    // array.new_default (if they are all equal to the default) or array.new (if
    // they are all equal to some other value). First, see if they are all
    // equal, which we do by comparing in pairs: [0,1], then [1,2], etc.
    for (Index i = 0; i < size - 1; i++) {
      if (!areConsecutiveInputsEqual(curr->values[i], curr->values[i + 1])) {
        return;
      }
    }

    // Great, they are all equal!

    Builder builder(*getModule());

    // See if they are equal to a constant, and if that constant is the default.
    auto type = curr->type.getHeapType().getArray().element.type;
    if (type.isDefaultable()) {
      auto* value = getFallthrough(curr->values[0]);

      if (Properties::isSingleConstantExpression(value) &&
          Properties::getLiteral(value) == Literal::makeZero(type)) {
        // They are all equal to the default. Drop the children and return an
        // array.new_with_default.
        auto* withDefault = builder.makeArrayNew(
          curr->type.getHeapType(), builder.makeConst(int32_t(size)));
        replaceCurrent(getDroppedChildrenAndAppend(curr, withDefault));
        return;
      }
    }

    // They are all equal to each other, but not to the default value. If there
    // are 2 or more elements here then we can save by using array.new. For
    // example, with 2 elements we are doing this:
    //
    //  (array.new_fixed
    //    (A)
    //    (A)
    //  )
    // =>
    //  (array.new
    //    (A)
    //    (i32.const 2) ;; get two copies of (A)
    //  )
    //
    // However, with 1, ArrayNewFixed is actually more compact, and we optimize
    // ArrayNew to it, above.
    if (size == 1) {
      return;
    }

    // Move children to locals, if we need to keep them around. We are removing
    // them all, except from the first, when we remove the array.new_fixed's
    // list of children and replace it with a single child + a constant for the
    // number of children.
    ChildLocalizer localizer(
      curr, getFunction(), *getModule(), getPassOptions());
    auto* block = localizer.getChildrenReplacement();
    auto* arrayNew = builder.makeArrayNew(curr->type.getHeapType(),
                                          builder.makeConst(int32_t(size)),
                                          curr->values[0]);
    block->list.push_back(arrayNew);
    block->finalize();
    replaceCurrent(block);
  }